

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a64assembler.cpp
# Opt level: O1

SizeOp asmjit::v1_14::a64::armElementTypeToSizeOp
                 (uint32_t vecOpType,RegType regType,VecElementType elementType)

{
  byte bVar1;
  ulong uVar2;
  undefined7 in_register_00000031;
  uint *puVar3;
  undefined4 in_register_0000003c;
  uint *puVar4;
  uint uVar5;
  
  puVar4 = (uint *)CONCAT44(in_register_0000003c,vecOpType);
  puVar3 = (uint *)CONCAT71(in_register_00000031,regType);
  if (vecOpType < 0x17) {
    if (elementType < 8) {
      uVar2 = (ulong)vecOpType;
      uVar5 = 5;
      if (regType - 8 < 5) {
        uVar5 = regType - 8;
      }
      bVar1 = 0xff;
      if ((*(ushort *)(sizeOpMap + uVar2 * 4 + 2) >>
           ((byte)sizeOpTable
                  [(ulong)(uVar5 << 3 | elementType) + (ulong)(byte)sizeOpMap[uVar2 * 4] * 0x28] &
           0x1f) & 1) != 0) {
        bVar1 = sizeOpMap[uVar2 * 4 + 1] &
                sizeOpTable
                [(ulong)(uVar5 << 3 | elementType) + (ulong)(byte)sizeOpMap[uVar2 * 4] * 0x28];
      }
      return (SizeOp)bVar1;
    }
  }
  else {
    armElementTypeToSizeOp();
  }
  armElementTypeToSizeOp();
  return (SizeOp)((puVar3[1] == (uint)(byte)commonHiRegIdOfType[*puVar3 >> 3 & 0x1f] ||
                  puVar3[1] < 0x1f) &&
                 (puVar4[1] == (uint)(byte)commonHiRegIdOfType[*puVar4 >> 3 & 0x1f] ||
                 puVar4[1] < 0x1f));
}

Assistant:

static inline SizeOp armElementTypeToSizeOp(uint32_t vecOpType, RegType regType, VecElementType elementType) noexcept {
  // Instruction data or Assembler is wrong if this triggers an assertion failure.
  ASMJIT_ASSERT(vecOpType < InstDB::kVO_Count);
  // ElementType uses 3 bits in the operand signature, it should never overflow.
  ASMJIT_ASSERT(uint32_t(elementType) <= 0x7u);

  const SizeOpMap& map = sizeOpMap[vecOpType];
  const SizeOpTable& table = sizeOpTable[map.tableId];

  size_t index = (Support::min<uint32_t>(diff(regType, RegType::kARM_VecB), diff(RegType::kARM_VecV, RegType::kARM_VecB) + 1) << 3) | uint32_t(elementType);
  SizeOp op = table.array[index];
  SizeOp modifiedOp { uint8_t(op.value & map.sizeOpMask) };

  if (!Support::bitTest(map.acceptMask, op.value))
    modifiedOp.makeInvalid();

  return modifiedOp;
}